

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QAV.h
# Opt level: O1

void __thiscall QAV<QBGPlanner_TreeIncPruneBnB>::GetQ(QAV<QBGPlanner_TreeIncPruneBnB> *this)

{
  Index in_EDX;
  Index in_ESI;
  
  GetQ((QAV<QBGPlanner_TreeIncPruneBnB> *)
       (&(this->super_QFunctionJointBelief).super_QFunctionJointBeliefInterface.field_0x0 +
       *(long *)((long)(this->super_QFunctionJointBelief).super_QFunctionJointBeliefInterface +
                -0x88)),in_ESI,in_EDX);
  return;
}

Assistant:

double GetQ(Index jaohI, Index jaI) const
        {
            Index t = GetPU()->GetTimeStepForJAOHI(jaohI);
            //Index t = GetPU()->GetJointActionObservationHistoryTree(jaohI)->
            //GetJointActionObservationHistory()->GetLength();
            JointBeliefInterface * jb = GetPU()->GetJointBeliefInterface(jaohI);
            double q = _m_p->GetQ (*jb, t, jaI);
            delete jb;
            return( q );
        }